

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffgi1b(fitsfile *fptr,LONGLONG byteloc,long nvals,long incre,uchar *values,int *status)

{
  LONGLONG LVar1;
  
  if (incre == 1) {
    if (nvals < 0x21c0) {
      ffmbyt(fptr,byteloc,0,status);
      ffgbyt(fptr,nvals,values,status);
    }
    else {
      LVar1 = fptr->Fptr->bytepos;
      fptr->Fptr->bytepos = byteloc;
      ffgbyt(fptr,nvals,values,status);
      fptr->Fptr->bytepos = LVar1;
    }
  }
  else {
    ffmbyt(fptr,byteloc,0,status);
    ffgbytoff(fptr,1,nvals,incre + -1,values,status);
  }
  return *status;
}

Assistant:

int ffgi1b(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG byteloc,  /* I - position within file to start reading     */
           long nvals,     /* I - number of pixels to read                  */
           long incre,     /* I - byte increment between pixels             */
           unsigned char *values, /* O - returned array of values           */
           int *status)    /* IO - error status                             */
/*
  get (read) the array of values from the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
    LONGLONG postemp;

    if (incre == 1)      /* read all the values at once (contiguous bytes) */
    {
        if (nvals < MINDIRECT)  /* read normally via IO buffers */
        {
           ffmbyt(fptr, byteloc, REPORT_EOF, status);
           ffgbyt(fptr, nvals, values, status);
        }
        else            /* read directly from disk, bypassing IO buffers */
        {
           postemp = (fptr->Fptr)->bytepos;   /* store current file position */
           (fptr->Fptr)->bytepos = byteloc;   /* set to the desired position */
           ffgbyt(fptr, nvals, values, status);
           (fptr->Fptr)->bytepos = postemp;   /* reset to original position */
        }
    }
    else         /* have to read each value individually (not contiguous ) */
    {
        ffmbyt(fptr, byteloc, REPORT_EOF, status);
        ffgbytoff(fptr, 1, nvals, incre - 1, values, status);
    }
    return(*status);
}